

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Compiler.cpp
# Opt level: O0

void soul::sanityCheckBuildSettings
               (BuildSettings *settings,uint32_t minBlockSize,uint32_t maxBlockSize)

{
  CompileMessage local_110;
  CodeLocation local_d8;
  CompileMessage local_c0;
  CodeLocation local_88;
  undefined8 local_78;
  double maxSampleRate;
  CompileMessage local_60;
  CodeLocation local_28;
  uint32_t local_18;
  uint32_t local_14;
  uint32_t maxBlockSize_local;
  uint32_t minBlockSize_local;
  BuildSettings *settings_local;
  
  local_18 = maxBlockSize;
  local_14 = minBlockSize;
  _maxBlockSize_local = settings;
  if ((settings->maxBlockSize != 0) &&
     ((settings->maxBlockSize < minBlockSize || (maxBlockSize < settings->maxBlockSize)))) {
    local_28.sourceCode.object = (SourceCodeText *)0x0;
    local_28.location.data = (char *)0x0;
    CodeLocation::CodeLocation(&local_28);
    Errors::unsupportedBlockSize<>();
    CodeLocation::throwError(&local_28,&local_60);
  }
  local_78 = 0x41524f8000000000;
  if ((0.0 < settings->sampleRate) && (settings->sampleRate <= 4800000.0)) {
    if ((-2 < settings->optimisationLevel) && (settings->optimisationLevel < 4)) {
      return;
    }
    local_d8.sourceCode.object = (SourceCodeText *)0x0;
    local_d8.location.data = (char *)0x0;
    CodeLocation::CodeLocation(&local_d8);
    Errors::unsupportedOptimisationLevel<>();
    CodeLocation::throwError(&local_d8,&local_110);
  }
  local_88.sourceCode.object = (SourceCodeText *)0x0;
  local_88.location.data = (char *)0x0;
  CodeLocation::CodeLocation(&local_88);
  Errors::unsupportedSampleRate<>();
  CodeLocation::throwError(&local_88,&local_c0);
}

Assistant:

static void sanityCheckBuildSettings (const BuildSettings& settings,
                                      uint32_t minBlockSize = 1, uint32_t maxBlockSize = 65536)
{
    if (settings.maxBlockSize != 0 && (settings.maxBlockSize < minBlockSize || settings.maxBlockSize > maxBlockSize))
        CodeLocation().throwError (Errors::unsupportedBlockSize());

    constexpr double maxSampleRate = 48000.0 * 100;

    if (settings.sampleRate <= 0 || settings.sampleRate > maxSampleRate)
        CodeLocation().throwError (Errors::unsupportedSampleRate());

    if (settings.optimisationLevel < -1 || settings.optimisationLevel > 3)
        CodeLocation().throwError (Errors::unsupportedOptimisationLevel());
}